

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

UBool __thiscall icu_63::UVector32::containsAll(UVector32 *this,UVector32 *other)

{
  UBool UVar1;
  long lVar2;
  long lVar3;
  
  UVar1 = '\x01';
  if (0 < (long)other->count) {
    if ((long)this->count < 1) {
LAB_002e3b6a:
      UVar1 = '\0';
    }
    else {
      lVar2 = 0;
      do {
        lVar3 = 0;
        while (this->elements[lVar3] != other->elements[lVar2]) {
          lVar3 = lVar3 + 1;
          if (this->count == lVar3) goto LAB_002e3b6a;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != other->count);
    }
  }
  return UVar1;
}

Assistant:

UBool UVector32::containsAll(const UVector32& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) < 0) {
            return FALSE;
        }
    }
    return TRUE;
}